

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O2

qreal __thiscall KDReports::SpreadsheetReportLayout::totalWidth(SpreadsheetReportLayout *this)

{
  const_reference pdVar1;
  int col;
  long i;
  qreal qVar2;
  
  qVar2 = 0.0;
  for (i = 0; i < (this->m_tableLayout).m_columnWidths.d.size; i = i + 1) {
    pdVar1 = QList<double>::at(&(this->m_tableLayout).m_columnWidths,i);
    qVar2 = qVar2 + *pdVar1;
  }
  if ((this->m_tableLayout).m_verticalHeaderVisible != false) {
    qVar2 = qVar2 + (this->m_tableLayout).m_vHeaderWidth;
  }
  return qVar2;
}

Assistant:

qreal KDReports::SpreadsheetReportLayout::totalWidth() const
{
    qreal totalWidth = 0;
    for (int col = 0; col < m_tableLayout.m_columnWidths.size(); ++col) {
        totalWidth += m_tableLayout.m_columnWidths[col];
    }
    if (m_tableLayout.m_verticalHeaderVisible)
        totalWidth += m_tableLayout.vHeaderWidth();
    return totalWidth;
}